

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopn.c
# Opt level: O1

void ym2610b_update_one(void *chip,UINT32 length,DEV_SMPL **buffer)

{
  FM_OPN *OPN;
  FM_CH *CH;
  FM_CH *CH_00;
  FM_CH *CH_01;
  FM_CH *CH_02;
  FM_CH *CH_03;
  FM_CH *CH_04;
  byte *pbVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  UINT8 UVar8;
  byte bVar9;
  uint uVar10;
  int chnum;
  int chnum_00;
  int chnum_01;
  int chnum_02;
  int chnum_03;
  ulong extraout_RDX;
  ulong uVar11;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  ulong uVar12;
  FM_SLOT *SLOT;
  DEV_SMPL *local_70;
  DEV_SMPL *local_68;
  
  OPN = (FM_OPN *)((long)chip + 0x208);
  if (buffer == (DEV_SMPL **)0x0) {
    local_68 = (DEV_SMPL *)0x0;
    local_70 = (DEV_SMPL *)0x0;
  }
  else {
    local_70 = *buffer;
    local_68 = buffer[1];
  }
  CH = (FM_CH *)((long)chip + 0x4778);
  CH_00 = (FM_CH *)((long)chip + 0x4910);
  CH_01 = (FM_CH *)((long)chip + 0x4aa8);
  CH_02 = (FM_CH *)((long)chip + 0x4c40);
  CH_03 = (FM_CH *)((long)chip + 0x4dd8);
  CH_04 = (FM_CH *)((long)chip + 0x4f70);
  refresh_fc_eg_chan(OPN,CH);
  refresh_fc_eg_chan(OPN,CH_00);
  if ((*(byte *)((long)chip + 0x230) & 0xc0) == 0) {
    refresh_fc_eg_chan(OPN,CH_01);
  }
  else if (*(int *)((long)chip + 0x4ad0) == -1) {
    iVar6 = *(int *)(*(long *)((long)chip + 0x4aa8) + (ulong)*(byte *)((long)chip + 0x68e) * 4) +
            *(int *)((long)chip + 0x684);
    if (iVar6 < 0) {
      iVar6 = iVar6 + *(int *)((long)chip + 0x46e8);
    }
    *(uint *)((long)chip + 0x4ad0) = (uint)(iVar6 * *(int *)((long)chip + 0x4ac8)) >> 1;
    bVar9 = *(byte *)((long)chip + 0x68e) >> (*(byte *)((long)chip + 0x4ab0) & 0x1f);
    uVar3 = (uint)bVar9;
    if (uVar3 != *(byte *)((long)chip + 0x4ac4)) {
      *(byte *)((long)chip + 0x4ac4) = bVar9;
      uVar10 = *(int *)((long)chip + 0x4ab4) + uVar3;
      if (uVar10 < 0x5e) {
        *(UINT8 *)((long)chip + 0x4ae8) =
             "\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\n\n\n\n\t\t\t\t\b\b\b\b\a\a\a\a\x06\x06\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x03\x03\x03\x03\x02\x02\x02\x02\x01\x01\x01\x01"
             [uVar10];
        UVar8 = eg_rate_select[uVar10];
      }
      else {
        *(undefined1 *)((long)chip + 0x4ae8) = 0;
        UVar8 = 0x90;
      }
      *(UINT8 *)((long)chip + 0x4ae9) = UVar8;
      uVar10 = *(int *)((long)chip + 0x4ab8) + uVar3;
      *(UINT8 *)((long)chip + 0x4aea) =
           "\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\n\n\n\n\t\t\t\t\b\b\b\b\a\a\a\a\x06\x06\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x03\x03\x03\x03\x02\x02\x02\x02\x01\x01\x01\x01"
           [uVar10];
      *(UINT8 *)((long)chip + 0x4aeb) = eg_rate_select[uVar10];
      uVar10 = *(int *)((long)chip + 0x4abc) + uVar3;
      *(UINT8 *)((long)chip + 0x4aec) =
           "\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\n\n\n\n\t\t\t\t\b\b\b\b\a\a\a\a\x06\x06\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x03\x03\x03\x03\x02\x02\x02\x02\x01\x01\x01\x01"
           [uVar10];
      *(UINT8 *)((long)chip + 0x4aed) = eg_rate_select[uVar10];
      uVar3 = uVar3 + *(int *)((long)chip + 0x4ac0);
      *(UINT8 *)((long)chip + 0x4aee) =
           "\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\n\n\n\n\t\t\t\t\b\b\b\b\a\a\a\a\x06\x06\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x03\x03\x03\x03\x02\x02\x02\x02\x01\x01\x01\x01"
           [uVar3];
      *(UINT8 *)((long)chip + 0x4aef) = eg_rate_select[uVar3];
    }
    iVar6 = *(int *)(*(long *)((long)chip + 0x4b48) + (ulong)*(byte *)((long)chip + 0x68f) * 4) +
            *(int *)((long)chip + 0x688);
    if (iVar6 < 0) {
      iVar6 = iVar6 + *(int *)((long)chip + 0x46e8);
    }
    *(uint *)((long)chip + 0x4b70) = (uint)(iVar6 * *(int *)((long)chip + 0x4b68)) >> 1;
    bVar9 = *(byte *)((long)chip + 0x68f) >> (*(byte *)((long)chip + 0x4b50) & 0x1f);
    uVar3 = (uint)bVar9;
    if (uVar3 != *(byte *)((long)chip + 0x4b64)) {
      *(byte *)((long)chip + 0x4b64) = bVar9;
      uVar10 = *(int *)((long)chip + 0x4b54) + uVar3;
      if (uVar10 < 0x5e) {
        *(UINT8 *)((long)chip + 0x4b88) =
             "\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\n\n\n\n\t\t\t\t\b\b\b\b\a\a\a\a\x06\x06\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x03\x03\x03\x03\x02\x02\x02\x02\x01\x01\x01\x01"
             [uVar10];
        UVar8 = eg_rate_select[uVar10];
      }
      else {
        *(undefined1 *)((long)chip + 0x4b88) = 0;
        UVar8 = 0x90;
      }
      *(UINT8 *)((long)chip + 0x4b89) = UVar8;
      uVar10 = *(int *)((long)chip + 0x4b58) + uVar3;
      *(UINT8 *)((long)chip + 0x4b8a) =
           "\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\n\n\n\n\t\t\t\t\b\b\b\b\a\a\a\a\x06\x06\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x03\x03\x03\x03\x02\x02\x02\x02\x01\x01\x01\x01"
           [uVar10];
      *(UINT8 *)((long)chip + 0x4b8b) = eg_rate_select[uVar10];
      uVar10 = *(int *)((long)chip + 0x4b5c) + uVar3;
      *(UINT8 *)((long)chip + 0x4b8c) =
           "\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\n\n\n\n\t\t\t\t\b\b\b\b\a\a\a\a\x06\x06\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x03\x03\x03\x03\x02\x02\x02\x02\x01\x01\x01\x01"
           [uVar10];
      *(UINT8 *)((long)chip + 0x4b8d) = eg_rate_select[uVar10];
      uVar3 = uVar3 + *(int *)((long)chip + 0x4b60);
      *(UINT8 *)((long)chip + 0x4b8e) =
           "\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\n\n\n\n\t\t\t\t\b\b\b\b\a\a\a\a\x06\x06\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x03\x03\x03\x03\x02\x02\x02\x02\x01\x01\x01\x01"
           [uVar3];
      *(UINT8 *)((long)chip + 0x4b8f) = eg_rate_select[uVar3];
    }
    iVar6 = *(int *)(*(long *)((long)chip + 0x4af8) + (ulong)*(byte *)((long)chip + 0x68d) * 4) +
            *(int *)((long)chip + 0x680);
    if (iVar6 < 0) {
      iVar6 = iVar6 + *(int *)((long)chip + 0x46e8);
    }
    *(uint *)((long)chip + 0x4b20) = (uint)(iVar6 * *(int *)((long)chip + 0x4b18)) >> 1;
    bVar9 = *(byte *)((long)chip + 0x68d) >> (*(byte *)((long)chip + 0x4b00) & 0x1f);
    uVar3 = (uint)bVar9;
    if (uVar3 != *(byte *)((long)chip + 0x4b14)) {
      *(byte *)((long)chip + 0x4b14) = bVar9;
      uVar10 = *(int *)((long)chip + 0x4b04) + uVar3;
      if (uVar10 < 0x5e) {
        *(UINT8 *)((long)chip + 0x4b38) =
             "\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\n\n\n\n\t\t\t\t\b\b\b\b\a\a\a\a\x06\x06\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x03\x03\x03\x03\x02\x02\x02\x02\x01\x01\x01\x01"
             [uVar10];
        UVar8 = eg_rate_select[uVar10];
      }
      else {
        *(undefined1 *)((long)chip + 0x4b38) = 0;
        UVar8 = 0x90;
      }
      *(UINT8 *)((long)chip + 0x4b39) = UVar8;
      uVar10 = *(int *)((long)chip + 0x4b08) + uVar3;
      *(UINT8 *)((long)chip + 0x4b3a) =
           "\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\n\n\n\n\t\t\t\t\b\b\b\b\a\a\a\a\x06\x06\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x03\x03\x03\x03\x02\x02\x02\x02\x01\x01\x01\x01"
           [uVar10];
      *(UINT8 *)((long)chip + 0x4b3b) = eg_rate_select[uVar10];
      uVar10 = *(int *)((long)chip + 0x4b0c) + uVar3;
      *(UINT8 *)((long)chip + 0x4b3c) =
           "\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\n\n\n\n\t\t\t\t\b\b\b\b\a\a\a\a\x06\x06\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x03\x03\x03\x03\x02\x02\x02\x02\x01\x01\x01\x01"
           [uVar10];
      *(UINT8 *)((long)chip + 0x4b3d) = eg_rate_select[uVar10];
      uVar3 = uVar3 + *(int *)((long)chip + 0x4b10);
      *(UINT8 *)((long)chip + 0x4b3e) =
           "\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\n\n\n\n\t\t\t\t\b\b\b\b\a\a\a\a\x06\x06\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x03\x03\x03\x03\x02\x02\x02\x02\x01\x01\x01\x01"
           [uVar3];
      *(UINT8 *)((long)chip + 0x4b3f) = eg_rate_select[uVar3];
    }
    iVar6 = *(int *)(*(long *)((long)chip + 0x4b98) + (ulong)*(byte *)((long)chip + 0x4c30) * 4) +
            *(int *)((long)chip + 0x4c2c);
    if (iVar6 < 0) {
      iVar6 = iVar6 + *(int *)((long)chip + 0x46e8);
    }
    *(uint *)((long)chip + 0x4bc0) = (uint)(iVar6 * *(int *)((long)chip + 0x4bb8)) >> 1;
    bVar9 = *(byte *)((long)chip + 0x4c30) >> (*(byte *)((long)chip + 0x4ba0) & 0x1f);
    uVar3 = (uint)bVar9;
    if (uVar3 != *(byte *)((long)chip + 0x4bb4)) {
      *(byte *)((long)chip + 0x4bb4) = bVar9;
      uVar10 = *(int *)((long)chip + 0x4ba4) + uVar3;
      if (uVar10 < 0x5e) {
        *(UINT8 *)((long)chip + 0x4bd8) =
             "\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\n\n\n\n\t\t\t\t\b\b\b\b\a\a\a\a\x06\x06\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x03\x03\x03\x03\x02\x02\x02\x02\x01\x01\x01\x01"
             [uVar10];
        UVar8 = eg_rate_select[uVar10];
      }
      else {
        *(undefined1 *)((long)chip + 0x4bd8) = 0;
        UVar8 = 0x90;
      }
      *(UINT8 *)((long)chip + 0x4bd9) = UVar8;
      uVar10 = *(int *)((long)chip + 0x4ba8) + uVar3;
      *(UINT8 *)((long)chip + 0x4bda) =
           "\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\n\n\n\n\t\t\t\t\b\b\b\b\a\a\a\a\x06\x06\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x03\x03\x03\x03\x02\x02\x02\x02\x01\x01\x01\x01"
           [uVar10];
      *(UINT8 *)((long)chip + 0x4bdb) = eg_rate_select[uVar10];
      uVar10 = *(int *)((long)chip + 0x4bac) + uVar3;
      *(UINT8 *)((long)chip + 0x4bdc) =
           "\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\n\n\n\n\t\t\t\t\b\b\b\b\a\a\a\a\x06\x06\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x03\x03\x03\x03\x02\x02\x02\x02\x01\x01\x01\x01"
           [uVar10];
      *(UINT8 *)((long)chip + 0x4bdd) = eg_rate_select[uVar10];
      uVar3 = uVar3 + *(int *)((long)chip + 0x4bb0);
      *(UINT8 *)((long)chip + 0x4bde) =
           "\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\n\n\n\n\t\t\t\t\b\b\b\b\a\a\a\a\x06\x06\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x03\x03\x03\x03\x02\x02\x02\x02\x01\x01\x01\x01"
           [uVar3];
      *(UINT8 *)((long)chip + 0x4bdf) = eg_rate_select[uVar3];
    }
  }
  refresh_fc_eg_chan(OPN,CH_02);
  refresh_fc_eg_chan(OPN,CH_03);
  refresh_fc_eg_chan(OPN,CH_04);
  if (length == 0) {
    lVar5 = 0;
    do {
      bVar9 = *(byte *)((long)chip + lVar5 + 0x47c0);
      if ((((bVar9 & 8) != 0) && (0x1ff < *(int *)((long)chip + lVar5 + 0x47ac))) &&
         (bVar2 = *(byte *)((long)chip + lVar5 + 0x47a4), 1 < bVar2)) {
        if ((bVar9 & 1) == 0) {
          if ((bVar9 & 2) == 0) {
            *(undefined4 *)((long)chip + lVar5 + 0x479c) = 0;
          }
          else {
            pbVar1 = (byte *)((long)chip + lVar5 + 0x47c1);
            *pbVar1 = *pbVar1 ^ 4;
          }
          if (bVar2 != 4) {
            if ((uint)*(byte *)((long)chip + lVar5 + 0x4794) + *(int *)((long)chip + lVar5 + 0x4784)
                < 0x5e) {
              *(undefined1 *)((long)chip + lVar5 + 0x47a4) = 4;
            }
            else {
              *(undefined4 *)((long)chip + lVar5 + 0x47ac) = 0;
              *(byte *)((long)chip + lVar5 + 0x47a4) =
                   *(int *)((long)chip + lVar5 + 0x47b0) == 0 ^ 3;
            }
          }
        }
        else {
          if ((bVar9 & 2) != 0) {
            *(undefined1 *)((long)chip + lVar5 + 0x47c1) = 4;
          }
          if ((bVar2 != 4) && (*(byte *)((long)chip + lVar5 + 0x47c1) == (bVar9 & 4))) {
            *(undefined4 *)((long)chip + lVar5 + 0x47ac) = 0x3ff;
          }
        }
        iVar6 = *(int *)((long)chip + lVar5 + 0x47ac);
        if (*(byte *)((long)chip + lVar5 + 0x47c1) == (bVar9 & 4)) {
          iVar6 = iVar6 + *(int *)((long)chip + lVar5 + 0x47a8);
        }
        else {
          iVar6 = (0x200U - iVar6 & 0x3ff) + *(int *)((long)chip + lVar5 + 0x47a8);
        }
        *(int *)((long)chip + lVar5 + 0x47b4) = iVar6;
      }
      lVar5 = lVar5 + 0x50;
    } while ((int)lVar5 != 0x140);
    lVar5 = 0;
    do {
      bVar9 = *(byte *)((long)chip + lVar5 + 0x4958);
      if ((((bVar9 & 8) != 0) && (0x1ff < *(int *)((long)chip + lVar5 + 0x4944))) &&
         (bVar2 = *(byte *)((long)chip + lVar5 + 0x493c), 1 < bVar2)) {
        if ((bVar9 & 1) == 0) {
          if ((bVar9 & 2) == 0) {
            *(undefined4 *)((long)chip + lVar5 + 0x4934) = 0;
          }
          else {
            pbVar1 = (byte *)((long)chip + lVar5 + 0x4959);
            *pbVar1 = *pbVar1 ^ 4;
          }
          if (bVar2 != 4) {
            if ((uint)*(byte *)((long)chip + lVar5 + 0x492c) + *(int *)((long)chip + lVar5 + 0x491c)
                < 0x5e) {
              *(undefined1 *)((long)chip + lVar5 + 0x493c) = 4;
            }
            else {
              *(undefined4 *)((long)chip + lVar5 + 0x4944) = 0;
              *(byte *)((long)chip + lVar5 + 0x493c) =
                   *(int *)((long)chip + lVar5 + 0x4948) == 0 ^ 3;
            }
          }
        }
        else {
          if ((bVar9 & 2) != 0) {
            *(undefined1 *)((long)chip + lVar5 + 0x4959) = 4;
          }
          if ((bVar2 != 4) && (*(byte *)((long)chip + lVar5 + 0x4959) == (bVar9 & 4))) {
            *(undefined4 *)((long)chip + lVar5 + 0x4944) = 0x3ff;
          }
        }
        iVar6 = *(int *)((long)chip + lVar5 + 0x4944);
        if (*(byte *)((long)chip + lVar5 + 0x4959) == (bVar9 & 4)) {
          iVar6 = iVar6 + *(int *)((long)chip + lVar5 + 0x4940);
        }
        else {
          iVar6 = (0x200U - iVar6 & 0x3ff) + *(int *)((long)chip + lVar5 + 0x4940);
        }
        *(int *)((long)chip + lVar5 + 0x494c) = iVar6;
      }
      lVar5 = lVar5 + 0x50;
    } while ((int)lVar5 != 0x140);
    lVar5 = 0;
    do {
      bVar9 = *(byte *)((long)chip + lVar5 + 0x4af0);
      if ((((bVar9 & 8) != 0) && (0x1ff < *(int *)((long)chip + lVar5 + 0x4adc))) &&
         (bVar2 = *(byte *)((long)chip + lVar5 + 0x4ad4), 1 < bVar2)) {
        if ((bVar9 & 1) == 0) {
          if ((bVar9 & 2) == 0) {
            *(undefined4 *)((long)chip + lVar5 + 0x4acc) = 0;
          }
          else {
            pbVar1 = (byte *)((long)chip + lVar5 + 0x4af1);
            *pbVar1 = *pbVar1 ^ 4;
          }
          if (bVar2 != 4) {
            if ((uint)*(byte *)((long)chip + lVar5 + 0x4ac4) + *(int *)((long)chip + lVar5 + 0x4ab4)
                < 0x5e) {
              *(undefined1 *)((long)chip + lVar5 + 0x4ad4) = 4;
            }
            else {
              *(undefined4 *)((long)chip + lVar5 + 0x4adc) = 0;
              *(byte *)((long)chip + lVar5 + 0x4ad4) =
                   *(int *)((long)chip + lVar5 + 0x4ae0) == 0 ^ 3;
            }
          }
        }
        else {
          if ((bVar9 & 2) != 0) {
            *(undefined1 *)((long)chip + lVar5 + 0x4af1) = 4;
          }
          if ((bVar2 != 4) && (*(byte *)((long)chip + lVar5 + 0x4af1) == (bVar9 & 4))) {
            *(undefined4 *)((long)chip + lVar5 + 0x4adc) = 0x3ff;
          }
        }
        iVar6 = *(int *)((long)chip + lVar5 + 0x4adc);
        if (*(byte *)((long)chip + lVar5 + 0x4af1) == (bVar9 & 4)) {
          iVar6 = iVar6 + *(int *)((long)chip + lVar5 + 0x4ad8);
        }
        else {
          iVar6 = (0x200U - iVar6 & 0x3ff) + *(int *)((long)chip + lVar5 + 0x4ad8);
        }
        *(int *)((long)chip + lVar5 + 0x4ae4) = iVar6;
      }
      lVar5 = lVar5 + 0x50;
    } while ((int)lVar5 != 0x140);
    lVar5 = 0;
    do {
      bVar9 = *(byte *)((long)chip + lVar5 + 0x4c88);
      if ((((bVar9 & 8) != 0) && (0x1ff < *(int *)((long)chip + lVar5 + 0x4c74))) &&
         (bVar2 = *(byte *)((long)chip + lVar5 + 0x4c6c), 1 < bVar2)) {
        if ((bVar9 & 1) == 0) {
          if ((bVar9 & 2) == 0) {
            *(undefined4 *)((long)chip + lVar5 + 0x4c64) = 0;
          }
          else {
            pbVar1 = (byte *)((long)chip + lVar5 + 0x4c89);
            *pbVar1 = *pbVar1 ^ 4;
          }
          if (bVar2 != 4) {
            if ((uint)*(byte *)((long)chip + lVar5 + 0x4c5c) + *(int *)((long)chip + lVar5 + 0x4c4c)
                < 0x5e) {
              *(undefined1 *)((long)chip + lVar5 + 0x4c6c) = 4;
            }
            else {
              *(undefined4 *)((long)chip + lVar5 + 0x4c74) = 0;
              *(byte *)((long)chip + lVar5 + 0x4c6c) =
                   *(int *)((long)chip + lVar5 + 0x4c78) == 0 ^ 3;
            }
          }
        }
        else {
          if ((bVar9 & 2) != 0) {
            *(undefined1 *)((long)chip + lVar5 + 0x4c89) = 4;
          }
          if ((bVar2 != 4) && (*(byte *)((long)chip + lVar5 + 0x4c89) == (bVar9 & 4))) {
            *(undefined4 *)((long)chip + lVar5 + 0x4c74) = 0x3ff;
          }
        }
        iVar6 = *(int *)((long)chip + lVar5 + 0x4c74);
        if (*(byte *)((long)chip + lVar5 + 0x4c89) == (bVar9 & 4)) {
          iVar6 = iVar6 + *(int *)((long)chip + lVar5 + 0x4c70);
        }
        else {
          iVar6 = (0x200U - iVar6 & 0x3ff) + *(int *)((long)chip + lVar5 + 0x4c70);
        }
        *(int *)((long)chip + lVar5 + 0x4c7c) = iVar6;
      }
      lVar5 = lVar5 + 0x50;
    } while ((int)lVar5 != 0x140);
    lVar5 = 0;
    do {
      bVar9 = *(byte *)((long)chip + lVar5 + 20000);
      if ((((bVar9 & 8) != 0) && (0x1ff < *(int *)((long)chip + lVar5 + 0x4e0c))) &&
         (bVar2 = *(byte *)((long)chip + lVar5 + 0x4e04), 1 < bVar2)) {
        if ((bVar9 & 1) == 0) {
          if ((bVar9 & 2) == 0) {
            *(undefined4 *)((long)chip + lVar5 + 0x4dfc) = 0;
          }
          else {
            pbVar1 = (byte *)((long)chip + lVar5 + 0x4e21);
            *pbVar1 = *pbVar1 ^ 4;
          }
          if (bVar2 != 4) {
            if ((uint)*(byte *)((long)chip + lVar5 + 0x4df4) + *(int *)((long)chip + lVar5 + 0x4de4)
                < 0x5e) {
              *(undefined1 *)((long)chip + lVar5 + 0x4e04) = 4;
            }
            else {
              *(undefined4 *)((long)chip + lVar5 + 0x4e0c) = 0;
              *(byte *)((long)chip + lVar5 + 0x4e04) =
                   *(int *)((long)chip + lVar5 + 0x4e10) == 0 ^ 3;
            }
          }
        }
        else {
          if ((bVar9 & 2) != 0) {
            *(undefined1 *)((long)chip + lVar5 + 0x4e21) = 4;
          }
          if ((bVar2 != 4) && (*(byte *)((long)chip + lVar5 + 0x4e21) == (bVar9 & 4))) {
            *(undefined4 *)((long)chip + lVar5 + 0x4e0c) = 0x3ff;
          }
        }
        iVar6 = *(int *)((long)chip + lVar5 + 0x4e0c);
        if (*(byte *)((long)chip + lVar5 + 0x4e21) == (bVar9 & 4)) {
          iVar6 = iVar6 + *(int *)((long)chip + lVar5 + 0x4e08);
        }
        else {
          iVar6 = (0x200U - iVar6 & 0x3ff) + *(int *)((long)chip + lVar5 + 0x4e08);
        }
        *(int *)((long)chip + lVar5 + 0x4e14) = iVar6;
      }
      lVar5 = lVar5 + 0x50;
    } while ((int)lVar5 != 0x140);
    lVar5 = 0;
    do {
      bVar9 = *(byte *)((long)chip + lVar5 + 0x4fb8);
      if ((((bVar9 & 8) != 0) && (0x1ff < *(int *)((long)chip + lVar5 + 0x4fa4))) &&
         (bVar2 = *(byte *)((long)chip + lVar5 + 0x4f9c), 1 < bVar2)) {
        if ((bVar9 & 1) == 0) {
          if ((bVar9 & 2) == 0) {
            *(undefined4 *)((long)chip + lVar5 + 0x4f94) = 0;
          }
          else {
            pbVar1 = (byte *)((long)chip + lVar5 + 0x4fb9);
            *pbVar1 = *pbVar1 ^ 4;
          }
          if (bVar2 != 4) {
            if ((uint)*(byte *)((long)chip + lVar5 + 0x4f8c) + *(int *)((long)chip + lVar5 + 0x4f7c)
                < 0x5e) {
              *(undefined1 *)((long)chip + lVar5 + 0x4f9c) = 4;
            }
            else {
              *(undefined4 *)((long)chip + lVar5 + 0x4fa4) = 0;
              *(byte *)((long)chip + lVar5 + 0x4f9c) =
                   *(int *)((long)chip + lVar5 + 0x4fa8) == 0 ^ 3;
            }
          }
        }
        else {
          if ((bVar9 & 2) != 0) {
            *(undefined1 *)((long)chip + lVar5 + 0x4fb9) = 4;
          }
          if ((bVar2 != 4) && (*(byte *)((long)chip + lVar5 + 0x4fb9) == (bVar9 & 4))) {
            *(undefined4 *)((long)chip + lVar5 + 0x4fa4) = 0x3ff;
          }
        }
        iVar6 = *(int *)((long)chip + lVar5 + 0x4fa4);
        if (*(byte *)((long)chip + lVar5 + 0x4fb9) == (bVar9 & 4)) {
          iVar6 = iVar6 + *(int *)((long)chip + lVar5 + 0x4fa0);
        }
        else {
          iVar6 = (0x200U - iVar6 & 0x3ff) + *(int *)((long)chip + lVar5 + 0x4fa0);
        }
        *(int *)((long)chip + lVar5 + 0x4fac) = iVar6;
      }
      lVar5 = lVar5 + 0x50;
    } while ((int)lVar5 != 0x140);
  }
  else {
    uVar12 = 0;
    uVar11 = extraout_RDX;
    do {
      *(undefined4 *)((long)chip + 0x4738) = 0;
      *(undefined8 *)((long)chip + 0x4730) = 0;
      *(undefined4 *)((long)chip + 0x4748) = 0;
      *(undefined8 *)((long)chip + 0x4740) = 0;
      *(undefined8 *)((long)chip + 0x4724) = 0;
      *(undefined8 *)((long)chip + 0x4714) = 0;
      *(undefined8 *)((long)chip + 0x471c) = 0;
      lVar5 = 0x47c1;
      do {
        bVar9 = *(byte *)((long)chip + lVar5 + -1);
        if (((bVar9 & 8) != 0) && (0x1ff < *(int *)((long)chip + lVar5 + -0x15))) {
          bVar2 = *(byte *)((long)chip + lVar5 + -0x1d);
          uVar11 = CONCAT71((int7)(uVar11 >> 8),bVar2);
          if (1 < bVar2) {
            if ((bVar9 & 1) == 0) {
              if ((bVar9 & 2) == 0) {
                *(undefined4 *)((long)chip + lVar5 + -0x25) = 0;
              }
              else {
                *(byte *)((long)chip + lVar5) = *(byte *)((long)chip + lVar5) ^ 4;
              }
              if (bVar2 != 4) {
                if ((uint)*(byte *)((long)chip + lVar5 + -0x2d) +
                    *(int *)((long)chip + lVar5 + -0x3d) < 0x5e) {
                  *(undefined1 *)((long)chip + lVar5 + -0x1d) = 4;
                }
                else {
                  *(undefined4 *)((long)chip + lVar5 + -0x15) = 0;
                  *(byte *)((long)chip + lVar5 + -0x1d) =
                       *(int *)((long)chip + lVar5 + -0x11) == 0 ^ 3;
                }
              }
            }
            else {
              if ((bVar9 & 2) != 0) {
                *(undefined1 *)((long)chip + lVar5) = 4;
              }
              if ((bVar2 != 4) && (*(byte *)((long)chip + lVar5) == (bVar9 & 4))) {
                *(undefined4 *)((long)chip + lVar5 + -0x15) = 0x3ff;
              }
            }
            uVar3 = *(uint *)((long)chip + lVar5 + -0x15);
            if (*(byte *)((long)chip + lVar5) == (bVar9 & 4)) {
              uVar10 = uVar3 + *(int *)((long)chip + lVar5 + -0x19);
              uVar3 = uVar10;
            }
            else {
              uVar10 = (0x200 - uVar3 & 0x3ff) + *(int *)((long)chip + lVar5 + -0x19);
            }
            uVar11 = (ulong)uVar3;
            *(uint *)((long)chip + lVar5 + -0xd) = uVar10;
          }
        }
        lVar5 = lVar5 + 0x50;
      } while ((int)lVar5 != 0x4901);
      lVar5 = 0x4959;
      do {
        bVar9 = *(byte *)((long)chip + lVar5 + -1);
        if (((bVar9 & 8) != 0) && (0x1ff < *(int *)((long)chip + lVar5 + -0x15))) {
          bVar2 = *(byte *)((long)chip + lVar5 + -0x1d);
          uVar11 = CONCAT71((int7)(uVar11 >> 8),bVar2);
          if (1 < bVar2) {
            if ((bVar9 & 1) == 0) {
              if ((bVar9 & 2) == 0) {
                *(undefined4 *)((long)chip + lVar5 + -0x25) = 0;
              }
              else {
                *(byte *)((long)chip + lVar5) = *(byte *)((long)chip + lVar5) ^ 4;
              }
              if (bVar2 != 4) {
                if ((uint)*(byte *)((long)chip + lVar5 + -0x2d) +
                    *(int *)((long)chip + lVar5 + -0x3d) < 0x5e) {
                  *(undefined1 *)((long)chip + lVar5 + -0x1d) = 4;
                }
                else {
                  *(undefined4 *)((long)chip + lVar5 + -0x15) = 0;
                  *(byte *)((long)chip + lVar5 + -0x1d) =
                       *(int *)((long)chip + lVar5 + -0x11) == 0 ^ 3;
                }
              }
            }
            else {
              if ((bVar9 & 2) != 0) {
                *(undefined1 *)((long)chip + lVar5) = 4;
              }
              if ((bVar2 != 4) && (*(byte *)((long)chip + lVar5) == (bVar9 & 4))) {
                *(undefined4 *)((long)chip + lVar5 + -0x15) = 0x3ff;
              }
            }
            uVar3 = *(uint *)((long)chip + lVar5 + -0x15);
            if (*(byte *)((long)chip + lVar5) == (bVar9 & 4)) {
              uVar10 = uVar3 + *(int *)((long)chip + lVar5 + -0x19);
              uVar3 = uVar10;
            }
            else {
              uVar10 = (0x200 - uVar3 & 0x3ff) + *(int *)((long)chip + lVar5 + -0x19);
            }
            uVar11 = (ulong)uVar3;
            *(uint *)((long)chip + lVar5 + -0xd) = uVar10;
          }
        }
        lVar5 = lVar5 + 0x50;
      } while ((int)lVar5 != 0x4a99);
      lVar5 = 0x4af1;
      do {
        bVar9 = *(byte *)((long)chip + lVar5 + -1);
        if (((bVar9 & 8) != 0) && (0x1ff < *(int *)((long)chip + lVar5 + -0x15))) {
          bVar2 = *(byte *)((long)chip + lVar5 + -0x1d);
          uVar11 = CONCAT71((int7)(uVar11 >> 8),bVar2);
          if (1 < bVar2) {
            if ((bVar9 & 1) == 0) {
              if ((bVar9 & 2) == 0) {
                *(undefined4 *)((long)chip + lVar5 + -0x25) = 0;
              }
              else {
                *(byte *)((long)chip + lVar5) = *(byte *)((long)chip + lVar5) ^ 4;
              }
              if (bVar2 != 4) {
                if ((uint)*(byte *)((long)chip + lVar5 + -0x2d) +
                    *(int *)((long)chip + lVar5 + -0x3d) < 0x5e) {
                  *(undefined1 *)((long)chip + lVar5 + -0x1d) = 4;
                }
                else {
                  *(undefined4 *)((long)chip + lVar5 + -0x15) = 0;
                  *(byte *)((long)chip + lVar5 + -0x1d) =
                       *(int *)((long)chip + lVar5 + -0x11) == 0 ^ 3;
                }
              }
            }
            else {
              if ((bVar9 & 2) != 0) {
                *(undefined1 *)((long)chip + lVar5) = 4;
              }
              if ((bVar2 != 4) && (*(byte *)((long)chip + lVar5) == (bVar9 & 4))) {
                *(undefined4 *)((long)chip + lVar5 + -0x15) = 0x3ff;
              }
            }
            uVar3 = *(uint *)((long)chip + lVar5 + -0x15);
            if (*(byte *)((long)chip + lVar5) == (bVar9 & 4)) {
              uVar10 = uVar3 + *(int *)((long)chip + lVar5 + -0x19);
              uVar3 = uVar10;
            }
            else {
              uVar10 = (0x200 - uVar3 & 0x3ff) + *(int *)((long)chip + lVar5 + -0x19);
            }
            uVar11 = (ulong)uVar3;
            *(uint *)((long)chip + lVar5 + -0xd) = uVar10;
          }
        }
        lVar5 = lVar5 + 0x50;
      } while ((int)lVar5 != 0x4c31);
      lVar5 = 0x4c89;
      do {
        bVar9 = *(byte *)((long)chip + lVar5 + -1);
        if (((bVar9 & 8) != 0) && (0x1ff < *(int *)((long)chip + lVar5 + -0x15))) {
          bVar2 = *(byte *)((long)chip + lVar5 + -0x1d);
          uVar11 = CONCAT71((int7)(uVar11 >> 8),bVar2);
          if (1 < bVar2) {
            if ((bVar9 & 1) == 0) {
              if ((bVar9 & 2) == 0) {
                *(undefined4 *)((long)chip + lVar5 + -0x25) = 0;
              }
              else {
                *(byte *)((long)chip + lVar5) = *(byte *)((long)chip + lVar5) ^ 4;
              }
              if (bVar2 != 4) {
                if ((uint)*(byte *)((long)chip + lVar5 + -0x2d) +
                    *(int *)((long)chip + lVar5 + -0x3d) < 0x5e) {
                  *(undefined1 *)((long)chip + lVar5 + -0x1d) = 4;
                }
                else {
                  *(undefined4 *)((long)chip + lVar5 + -0x15) = 0;
                  *(byte *)((long)chip + lVar5 + -0x1d) =
                       *(int *)((long)chip + lVar5 + -0x11) == 0 ^ 3;
                }
              }
            }
            else {
              if ((bVar9 & 2) != 0) {
                *(undefined1 *)((long)chip + lVar5) = 4;
              }
              if ((bVar2 != 4) && (*(byte *)((long)chip + lVar5) == (bVar9 & 4))) {
                *(undefined4 *)((long)chip + lVar5 + -0x15) = 0x3ff;
              }
            }
            uVar3 = *(uint *)((long)chip + lVar5 + -0x15);
            if (*(byte *)((long)chip + lVar5) == (bVar9 & 4)) {
              uVar10 = uVar3 + *(int *)((long)chip + lVar5 + -0x19);
              uVar3 = uVar10;
            }
            else {
              uVar10 = (0x200 - uVar3 & 0x3ff) + *(int *)((long)chip + lVar5 + -0x19);
            }
            uVar11 = (ulong)uVar3;
            *(uint *)((long)chip + lVar5 + -0xd) = uVar10;
          }
        }
        lVar5 = lVar5 + 0x50;
      } while ((int)lVar5 != 0x4dc9);
      lVar5 = 0x4e21;
      do {
        bVar9 = *(byte *)((long)chip + lVar5 + -1);
        if (((bVar9 & 8) != 0) && (0x1ff < *(int *)((long)chip + lVar5 + -0x15))) {
          bVar2 = *(byte *)((long)chip + lVar5 + -0x1d);
          uVar11 = CONCAT71((int7)(uVar11 >> 8),bVar2);
          if (1 < bVar2) {
            if ((bVar9 & 1) == 0) {
              if ((bVar9 & 2) == 0) {
                *(undefined4 *)((long)chip + lVar5 + -0x25) = 0;
              }
              else {
                *(byte *)((long)chip + lVar5) = *(byte *)((long)chip + lVar5) ^ 4;
              }
              if (bVar2 != 4) {
                if ((uint)*(byte *)((long)chip + lVar5 + -0x2d) +
                    *(int *)((long)chip + lVar5 + -0x3d) < 0x5e) {
                  *(undefined1 *)((long)chip + lVar5 + -0x1d) = 4;
                }
                else {
                  *(undefined4 *)((long)chip + lVar5 + -0x15) = 0;
                  *(byte *)((long)chip + lVar5 + -0x1d) =
                       *(int *)((long)chip + lVar5 + -0x11) == 0 ^ 3;
                }
              }
            }
            else {
              if ((bVar9 & 2) != 0) {
                *(undefined1 *)((long)chip + lVar5) = 4;
              }
              if ((bVar2 != 4) && (*(byte *)((long)chip + lVar5) == (bVar9 & 4))) {
                *(undefined4 *)((long)chip + lVar5 + -0x15) = 0x3ff;
              }
            }
            uVar3 = *(uint *)((long)chip + lVar5 + -0x15);
            if (*(byte *)((long)chip + lVar5) == (bVar9 & 4)) {
              uVar10 = uVar3 + *(int *)((long)chip + lVar5 + -0x19);
              uVar3 = uVar10;
            }
            else {
              uVar10 = (0x200 - uVar3 & 0x3ff) + *(int *)((long)chip + lVar5 + -0x19);
            }
            uVar11 = (ulong)uVar3;
            *(uint *)((long)chip + lVar5 + -0xd) = uVar10;
          }
        }
        lVar5 = lVar5 + 0x50;
      } while ((int)lVar5 != 0x4f61);
      lVar5 = 0x4fb9;
      do {
        bVar9 = *(byte *)((long)chip + lVar5 + -1);
        if (((bVar9 & 8) != 0) && (0x1ff < *(int *)((long)chip + lVar5 + -0x15))) {
          bVar2 = *(byte *)((long)chip + lVar5 + -0x1d);
          uVar11 = CONCAT71((int7)(uVar11 >> 8),bVar2);
          if (1 < bVar2) {
            if ((bVar9 & 1) == 0) {
              if ((bVar9 & 2) == 0) {
                *(undefined4 *)((long)chip + lVar5 + -0x25) = 0;
              }
              else {
                *(byte *)((long)chip + lVar5) = *(byte *)((long)chip + lVar5) ^ 4;
              }
              if (bVar2 != 4) {
                if ((uint)*(byte *)((long)chip + lVar5 + -0x2d) +
                    *(int *)((long)chip + lVar5 + -0x3d) < 0x5e) {
                  *(undefined1 *)((long)chip + lVar5 + -0x1d) = 4;
                }
                else {
                  *(undefined4 *)((long)chip + lVar5 + -0x15) = 0;
                  *(byte *)((long)chip + lVar5 + -0x1d) =
                       *(int *)((long)chip + lVar5 + -0x11) == 0 ^ 3;
                }
              }
            }
            else {
              if ((bVar9 & 2) != 0) {
                *(undefined1 *)((long)chip + lVar5) = 4;
              }
              if ((bVar2 != 4) && (*(byte *)((long)chip + lVar5) == (bVar9 & 4))) {
                *(undefined4 *)((long)chip + lVar5 + -0x15) = 0x3ff;
              }
            }
            uVar3 = *(uint *)((long)chip + lVar5 + -0x15);
            if (*(byte *)((long)chip + lVar5) == (bVar9 & 4)) {
              uVar10 = uVar3 + *(int *)((long)chip + lVar5 + -0x19);
              uVar3 = uVar10;
            }
            else {
              uVar10 = (0x200 - uVar3 & 0x3ff) + *(int *)((long)chip + lVar5 + -0x19);
            }
            uVar11 = (ulong)uVar3;
            *(uint *)((long)chip + lVar5 + -0xd) = uVar10;
          }
        }
        lVar5 = lVar5 + 0x50;
      } while ((int)lVar5 != 0x50f9);
      chan_calc(OPN,CH,(int)uVar11);
      chan_calc(OPN,CH_00,chnum);
      chan_calc(OPN,CH_01,chnum_00);
      chan_calc(OPN,CH_02,chnum_01);
      chan_calc(OPN,CH_03,chnum_02);
      chan_calc(OPN,CH_04,chnum_03);
      if ((*(char *)((long)chip + 0x53d2) < '\0') && (*(char *)((long)chip + 0x5408) == '\0')) {
        YM_DELTAT_ADPCM_CALC((YM_DELTAT *)((long)chip + 0x5368));
      }
      lVar5 = 0x5120;
      do {
        if (*(char *)((long)chip + lVar5) != '\0') {
          ADPCMA_calc_chan((YM2610 *)chip,(ADPCM_CH *)((long)chip + lVar5));
        }
        lVar5 = lVar5 + 0x40;
      } while (lVar5 != 0x52a0);
      uVar3 = *(uint *)((long)chip + 0x46f8);
      if (uVar3 != 0) {
        uVar10 = *(int *)((long)chip + 0x46f0) + *(int *)((long)chip + 0x46f4);
        *(uint *)((long)chip + 0x46f0) = uVar10;
        if (uVar3 <= uVar10) {
          bVar9 = *(byte *)((long)chip + 0x46ec);
          do {
            uVar10 = uVar10 - uVar3;
            bVar9 = bVar9 + 1 & 0x7f;
          } while (uVar3 <= uVar10);
          uVar3 = (uint)bVar9 + (uint)bVar9 ^ 0x7e;
          if (0x3f < bVar9) {
            uVar3 = (uint)bVar9 + (uint)bVar9 & 0x7e;
          }
          *(uint *)((long)chip + 0x46fc) = uVar3;
          *(uint *)((long)chip + 0x46f0) = uVar10;
          *(byte *)((long)chip + 0x46ec) = bVar9;
          *(uint *)((long)chip + 0x4700) = (uint)(bVar9 >> 2);
        }
      }
      uVar3 = *(uint *)((long)chip + 0x6e4);
      uVar10 = *(int *)((long)chip + 0x6dc) + *(int *)((long)chip + 0x6e0);
      *(uint *)((long)chip + 0x6dc) = uVar10;
      if (uVar3 <= uVar10) {
        do {
          *(uint *)((long)chip + 0x6dc) = uVar10 - uVar3;
          *(int *)((long)chip + 0x6d8) = *(int *)((long)chip + 0x6d8) + 1;
          advance_eg_channel(OPN,(FM_SLOT *)CH);
          advance_eg_channel(OPN,(FM_SLOT *)CH_00);
          advance_eg_channel(OPN,(FM_SLOT *)CH_01);
          advance_eg_channel(OPN,(FM_SLOT *)CH_02);
          advance_eg_channel(OPN,(FM_SLOT *)CH_03);
          advance_eg_channel(OPN,(FM_SLOT *)CH_04);
          uVar10 = *(uint *)((long)chip + 0x6dc);
          uVar3 = *(uint *)((long)chip + 0x6e4);
        } while (uVar3 <= uVar10);
      }
      uVar3 = (*(uint *)((long)chip + 0x4728) & *(uint *)((long)chip + 0x6d4)) +
              (*(uint *)((long)chip + 0x4724) & *(uint *)((long)chip + 0x6cc)) +
              (*(uint *)((long)chip + 0x4720) & *(uint *)((long)chip + 0x6c4)) +
              (*(uint *)((long)chip + 0x471c) & *(uint *)((long)chip + 0x6bc)) +
              (*(uint *)((long)chip + 0x4718) & *(uint *)((long)chip + 0x6b4)) +
              (*(uint *)((long)chip + 0x4714) & *(uint *)((long)chip + 0x6ac)) +
              (*(int *)((long)chip + 0x4748) + *(int *)((long)chip + 0x4740) >> 8) +
              (*(int *)((long)chip + 0x4738) + *(int *)((long)chip + 0x4730)) * 2;
      uVar11 = (ulong)uVar3;
      local_70[uVar12] =
           (*(uint *)((long)chip + 0x6d0) & *(uint *)((long)chip + 0x4728)) +
           (*(uint *)((long)chip + 0x6c8) & *(uint *)((long)chip + 0x4724)) +
           (*(uint *)((long)chip + 0x6c0) & *(uint *)((long)chip + 0x4720)) +
           (*(uint *)((long)chip + 0x6b8) & *(uint *)((long)chip + 0x471c)) +
           (*(uint *)((long)chip + 0x6b0) & *(uint *)((long)chip + 0x4718)) +
           (*(uint *)((long)chip + 0x6a8) & *(uint *)((long)chip + 0x4714)) +
           (*(int *)((long)chip + 0x4744) + *(int *)((long)chip + 0x4748) >> 8) +
           (*(int *)((long)chip + 0x4734) + *(int *)((long)chip + 0x4738)) * 2;
      local_68[uVar12] = uVar3;
      *(char *)((long)chip + 0x69c) = *(char *)((long)chip + 0x69c) << 1;
      iVar6 = *(int *)((long)chip + 0x23c);
      if (((iVar6 != 0) && (*(long *)((long)chip + 0x648) == 0)) &&
         (iVar7 = (int)(*(double *)((long)chip + 0x220) * 4096.0), iVar4 = iVar6 - iVar7,
         *(int *)((long)chip + 0x23c) = iVar4, iVar4 == 0 || iVar6 < iVar7)) {
        if ((*(byte *)((long)chip + 0x230) & 4) != 0) {
          bVar9 = *(byte *)((long)chip + 0x22f) | 1;
          *(byte *)((long)chip + 0x22f) = bVar9;
          if ((*(char *)((long)chip + 0x22d) == '\0') &&
             ((*(byte *)((long)chip + 0x22e) & bVar9) != 0)) {
            *(undefined1 *)((long)chip + 0x22d) = 1;
            if (*(code **)((long)chip + 0x650) != (code *)0x0) {
              (**(code **)((long)chip + 0x650))(*(undefined8 *)((long)chip + 0x210),1);
            }
          }
        }
        uVar3 = 0x400 - *(int *)((long)chip + 0x238);
        uVar11 = (ulong)uVar3;
        *(uint *)((long)chip + 0x23c) = uVar3;
        if (*(code **)((long)chip + 0x648) != (code *)0x0) {
          (**(code **)((long)chip + 0x648))
                    (*(undefined8 *)((long)chip + 0x210),0,uVar3 * *(int *)((long)chip + 0x228),
                     *(undefined4 *)((long)chip + 0x218));
          uVar11 = extraout_RDX_00;
        }
        *(int *)((long)chip + 0x23c) = *(int *)((long)chip + 0x23c) << 0xc;
        if ((*(uint *)((long)chip + 0x230) & 0xc0) == 0x80) {
          CSMKeyControl(OPN,CH_01);
          uVar11 = extraout_RDX_01;
        }
      }
      if ((*(byte *)((long)chip + 0x69c) & 2) != 0) {
        if ((*(char *)((long)chip + 0x4af2) == '\0') && (1 < *(byte *)((long)chip + 0x4ad4))) {
          *(undefined1 *)((long)chip + 0x4ad4) = 1;
          if ((*(byte *)((long)chip + 0x4af0) & 8) != 0) {
            if ((*(byte *)((long)chip + 0x4af0) & 4) != *(byte *)((long)chip + 0x4af1)) {
              *(uint *)((long)chip + 0x4adc) = 0x200U - *(int *)((long)chip + 0x4adc) & 0x3ff;
            }
            if (0x1ff < *(int *)((long)chip + 0x4adc)) {
              *(undefined4 *)((long)chip + 0x4adc) = 0x3ff;
              *(undefined1 *)((long)chip + 0x4ad4) = 0;
            }
            *(int *)((long)chip + 0x4ae4) =
                 *(int *)((long)chip + 0x4ad8) + *(int *)((long)chip + 0x4adc);
          }
        }
        if ((*(char *)((long)chip + 0x4b92) == '\0') && (1 < *(byte *)((long)chip + 0x4b74))) {
          *(undefined1 *)((long)chip + 0x4b74) = 1;
          if ((*(byte *)((long)chip + 0x4b90) & 8) != 0) {
            if ((*(byte *)((long)chip + 0x4b90) & 4) != *(byte *)((long)chip + 0x4b91)) {
              *(uint *)((long)chip + 0x4b7c) = 0x200U - *(int *)((long)chip + 0x4b7c) & 0x3ff;
            }
            if (0x1ff < *(int *)((long)chip + 0x4b7c)) {
              *(undefined4 *)((long)chip + 0x4b7c) = 0x3ff;
              *(undefined1 *)((long)chip + 0x4b74) = 0;
            }
            *(int *)((long)chip + 0x4b84) =
                 *(int *)((long)chip + 0x4b78) + *(int *)((long)chip + 0x4b7c);
          }
        }
        if ((*(char *)((long)chip + 0x4b42) == '\0') && (1 < *(byte *)((long)chip + 0x4b24))) {
          *(undefined1 *)((long)chip + 0x4b24) = 1;
          if ((*(byte *)((long)chip + 0x4b40) & 8) != 0) {
            if ((*(byte *)((long)chip + 0x4b40) & 4) != *(byte *)((long)chip + 0x4b41)) {
              *(uint *)((long)chip + 0x4b2c) = 0x200U - *(int *)((long)chip + 0x4b2c) & 0x3ff;
            }
            if (0x1ff < *(int *)((long)chip + 0x4b2c)) {
              *(undefined4 *)((long)chip + 0x4b2c) = 0x3ff;
              *(undefined1 *)((long)chip + 0x4b24) = 0;
            }
            *(int *)((long)chip + 0x4b34) =
                 *(int *)((long)chip + 0x4b28) + *(int *)((long)chip + 0x4b2c);
          }
        }
        if ((*(char *)((long)chip + 0x4be2) == '\0') && (1 < *(byte *)((long)chip + 0x4bc4))) {
          *(undefined1 *)((long)chip + 0x4bc4) = 1;
          if ((*(byte *)((long)chip + 0x4be0) & 8) != 0) {
            if ((*(byte *)((long)chip + 0x4be0) & 4) != *(byte *)((long)chip + 0x4be1)) {
              *(uint *)((long)chip + 0x4bcc) = 0x200U - *(int *)((long)chip + 0x4bcc) & 0x3ff;
            }
            if (0x1ff < *(int *)((long)chip + 0x4bcc)) {
              *(undefined4 *)((long)chip + 0x4bcc) = 0x3ff;
              *(undefined1 *)((long)chip + 0x4bc4) = 0;
            }
            *(int *)((long)chip + 0x4bd4) =
                 *(int *)((long)chip + 0x4bc8) + *(int *)((long)chip + 0x4bcc);
          }
        }
        *(undefined1 *)((long)chip + 0x69c) = 0;
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 != length);
  }
  iVar6 = *(int *)((long)chip + 0x244);
  if (((iVar6 != 0) && (*(long *)((long)chip + 0x648) == 0)) &&
     (iVar7 = (int)((double)length * *(double *)((long)chip + 0x220) * 4096.0),
     iVar4 = iVar6 - iVar7, *(int *)((long)chip + 0x244) = iVar4, iVar4 == 0 || iVar6 < iVar7)) {
    if ((*(byte *)((long)chip + 0x230) & 8) != 0) {
      bVar9 = *(byte *)((long)chip + 0x22f) | 2;
      *(byte *)((long)chip + 0x22f) = bVar9;
      if ((*(char *)((long)chip + 0x22d) == '\0') && ((*(byte *)((long)chip + 0x22e) & bVar9) != 0))
      {
        *(undefined1 *)((long)chip + 0x22d) = 1;
        if (*(code **)((long)chip + 0x650) != (code *)0x0) {
          (**(code **)((long)chip + 0x650))(*(undefined8 *)((long)chip + 0x210),1);
        }
      }
    }
    iVar6 = (uint)*(byte *)((long)chip + 0x240) * -0x10 + 0x1000;
    *(int *)((long)chip + 0x244) = iVar6;
    if (*(code **)((long)chip + 0x648) != (code *)0x0) {
      (**(code **)((long)chip + 0x648))
                (*(undefined8 *)((long)chip + 0x210),1,iVar6 * *(int *)((long)chip + 0x228),
                 *(undefined4 *)((long)chip + 0x218));
    }
    *(int *)((long)chip + 0x244) = *(int *)((long)chip + 0x244) << 0xc;
  }
  return;
}

Assistant:

void ym2610b_update_one(void *chip, UINT32 length, DEV_SMPL **buffer)
{
	YM2610 *F2610 = (YM2610 *)chip;
	FM_OPN *OPN   = &F2610->OPN;
	YM_DELTAT *DELTAT = &F2610->deltaT;
	UINT32 i;
	UINT8 j;
	DEV_SMPL  *bufL,*bufR;
	FM_CH   *cch[6];
	INT32 *out_fm = OPN->out_fm;

	/* buffer setup */
	if (buffer != NULL)
	{
		bufL = buffer[0];
		bufR = buffer[1];
	}
	else
	{
		bufL = bufR = NULL;
	}

	cch[0] = &F2610->CH[0];
	cch[1] = &F2610->CH[1];
	cch[2] = &F2610->CH[2];
	cch[3] = &F2610->CH[3];
	cch[4] = &F2610->CH[4];
	cch[5] = &F2610->CH[5];

	/* refresh PG and EG */
	refresh_fc_eg_chan( OPN, cch[0] );
	refresh_fc_eg_chan( OPN, cch[1] );
	if( (OPN->ST.mode & 0xc0) )
	{
		/* 3SLOT MODE */
		if( cch[2]->SLOT[SLOT1].Incr==-1)
		{
			refresh_fc_eg_slot(OPN, &cch[2]->SLOT[SLOT1] , OPN->SL3.fc[1] , OPN->SL3.kcode[1] );
			refresh_fc_eg_slot(OPN, &cch[2]->SLOT[SLOT2] , OPN->SL3.fc[2] , OPN->SL3.kcode[2] );
			refresh_fc_eg_slot(OPN, &cch[2]->SLOT[SLOT3] , OPN->SL3.fc[0] , OPN->SL3.kcode[0] );
			refresh_fc_eg_slot(OPN, &cch[2]->SLOT[SLOT4] , cch[2]->fc , cch[2]->kcode );
		}
	}
	else
		refresh_fc_eg_chan( OPN, cch[2] );
	refresh_fc_eg_chan( OPN, cch[3] );
	refresh_fc_eg_chan( OPN, cch[4] );
	refresh_fc_eg_chan( OPN, cch[5] );
	if (! length)
	{
		update_ssg_eg_channel(&cch[0]->SLOT[SLOT1]);
		update_ssg_eg_channel(&cch[1]->SLOT[SLOT1]);
		update_ssg_eg_channel(&cch[2]->SLOT[SLOT1]);
		update_ssg_eg_channel(&cch[3]->SLOT[SLOT1]);
		update_ssg_eg_channel(&cch[4]->SLOT[SLOT1]);
		update_ssg_eg_channel(&cch[5]->SLOT[SLOT1]);
	}

	/* buffering */
	for(i=0; i < length ; i++)
	{
		/* clear output acc. */
		OPN->out_adpcm[OUTD_LEFT] = OPN->out_adpcm[OUTD_RIGHT] = OPN->out_adpcm[OUTD_CENTER] = 0;
		OPN->out_delta[OUTD_LEFT] = OPN->out_delta[OUTD_RIGHT] = OPN->out_delta[OUTD_CENTER] = 0;
		/* clear outputs */
		out_fm[0] = 0;
		out_fm[1] = 0;
		out_fm[2] = 0;
		out_fm[3] = 0;
		out_fm[4] = 0;
		out_fm[5] = 0;

		/* update SSG-EG output */
		update_ssg_eg_channel(&cch[0]->SLOT[SLOT1]);
		update_ssg_eg_channel(&cch[1]->SLOT[SLOT1]);
		update_ssg_eg_channel(&cch[2]->SLOT[SLOT1]);
		update_ssg_eg_channel(&cch[3]->SLOT[SLOT1]);
		update_ssg_eg_channel(&cch[4]->SLOT[SLOT1]);
		update_ssg_eg_channel(&cch[5]->SLOT[SLOT1]);

		/* calculate FM */
		chan_calc(OPN, cch[0], 0 );
		chan_calc(OPN, cch[1], 1 );
		chan_calc(OPN, cch[2], 2 );
		chan_calc(OPN, cch[3], 3 );
		chan_calc(OPN, cch[4], 4 );
		chan_calc(OPN, cch[5], 5 );

		/* deltaT ADPCM */
		if( DELTAT->portstate&0x80 && ! F2610->MuteDeltaT )
			YM_DELTAT_ADPCM_CALC(DELTAT);

		/* ADPCMA */
		for( j = 0; j < 6; j++ )
		{
			if( F2610->adpcm[j].flag )
				ADPCMA_calc_chan( F2610, &F2610->adpcm[j]);
		}

		/* advance LFO */
		advance_lfo(OPN);

		/* advance envelope generator */
		OPN->eg_timer += OPN->eg_timer_add;
		while (OPN->eg_timer >= OPN->eg_timer_overflow)
		{
			OPN->eg_timer -= OPN->eg_timer_overflow;
			OPN->eg_cnt++;

			advance_eg_channel(OPN, &cch[0]->SLOT[SLOT1]);
			advance_eg_channel(OPN, &cch[1]->SLOT[SLOT1]);
			advance_eg_channel(OPN, &cch[2]->SLOT[SLOT1]);
			advance_eg_channel(OPN, &cch[3]->SLOT[SLOT1]);
			advance_eg_channel(OPN, &cch[4]->SLOT[SLOT1]);
			advance_eg_channel(OPN, &cch[5]->SLOT[SLOT1]);
		}


		/* buffering */
		{
			DEV_SMPL lt,rt;

			lt =  (OPN->out_adpcm[OUTD_LEFT]  + OPN->out_adpcm[OUTD_CENTER])<<1;
			rt =  (OPN->out_adpcm[OUTD_RIGHT] + OPN->out_adpcm[OUTD_CENTER])<<1;
			lt += (OPN->out_delta[OUTD_LEFT]  + OPN->out_delta[OUTD_CENTER])>>8;
			rt += (OPN->out_delta[OUTD_RIGHT] + OPN->out_delta[OUTD_CENTER])>>8;

			lt += (out_fm[0] & OPN->pan[0]);
			rt += (out_fm[0] & OPN->pan[1]);
			lt += (out_fm[1] & OPN->pan[2]);
			rt += (out_fm[1] & OPN->pan[3]);
			lt += (out_fm[2] & OPN->pan[4]);
			rt += (out_fm[2] & OPN->pan[5]);
			lt += (out_fm[3] & OPN->pan[6]);
			rt += (out_fm[3] & OPN->pan[7]);
			lt += (out_fm[4] & OPN->pan[8]);
			rt += (out_fm[4] & OPN->pan[9]);
			lt += (out_fm[5] & OPN->pan[10]);
			rt += (out_fm[5] & OPN->pan[11]);

			//lt >>= 1; // the shift right is verified on YM2610
			//rt >>= 1;

			/* buffering */
			bufL[i] = lt;
			bufR[i] = rt;
		}

		/* CSM mode: if CSM Key ON has occured, CSM Key OFF need to be sent       */
		/* only if Timer A does not overflow again (i.e CSM Key ON not set again) */
		OPN->SL3.key_csm <<= 1;

		/* timer A control */
		INTERNAL_TIMER_A( &OPN->ST , cch[2] )

		/* CSM Mode Key ON still disabled */
		if (OPN->SL3.key_csm & 2)
		{
			/* CSM Mode Key OFF (verified by Nemesis on real hardware) */
			FM_KEYOFF_CSM(cch[2],SLOT1);
			FM_KEYOFF_CSM(cch[2],SLOT2);
			FM_KEYOFF_CSM(cch[2],SLOT3);
			FM_KEYOFF_CSM(cch[2],SLOT4);
			OPN->SL3.key_csm = 0;
		}
	}

	/* timer B control */
	INTERNAL_TIMER_B(&OPN->ST,length)
}